

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::setUnicode(QString *this,QChar *unicode,qsizetype size)

{
  char16_t *__dest;
  long in_RDX;
  void *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  qsizetype in_stack_ffffffffffffffd8;
  
  resize((QString *)in_RDI,in_stack_ffffffffffffffd8);
  if ((in_RSI != (void *)0x0) && (in_RDX != 0)) {
    __dest = QArrayDataPointer<char16_t>::data(in_RDI);
    memcpy(__dest,in_RSI,in_RDX << 1);
  }
  return (QString *)in_RDI;
}

Assistant:

QString& QString::setUnicode(const QChar *unicode, qsizetype size)
{
     resize(size);
     if (unicode && size)
         memcpy(d.data(), unicode, size * sizeof(QChar));
     return *this;
}